

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::setSelection(QTreeView *this,QRect *rect,SelectionFlags command)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  QTreeViewPrivate *this_00;
  QTreeViewItem *pQVar6;
  QHeaderView *this_01;
  long lVar7;
  QAbstractItemModel *pQVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  LayoutDirection LVar11;
  QItemSelectionModel *pQVar12;
  undefined1 **ppuVar13;
  ulong uVar14;
  fd_set *in_R8;
  timeval *in_R9;
  long in_FS_OFFSET;
  bool bVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QAbstractItemModel *local_b8;
  undefined8 local_a8;
  undefined1 *puStack_a0;
  QAbstractItemModel *local_98;
  undefined8 local_88;
  undefined1 *puStack_80;
  QAbstractItemModel *local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QAbstractItemModel *local_58;
  undefined4 local_48;
  int local_44;
  undefined4 local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar12 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  if ((pQVar12 != (QItemSelectionModel *)0x0) &&
     (uVar1 = rect->x1, uVar3 = rect->y1, uVar2 = rect->x2, uVar4 = rect->y2,
     auVar16._0_4_ = -(uint)(uVar2 == uVar1 + -1), iVar17 = -(uint)(uVar4 == uVar3 + -1),
     auVar16._4_4_ = auVar16._0_4_, auVar16._8_4_ = iVar17, auVar16._12_4_ = iVar17,
     iVar17 = movmskpd((int)pQVar12,auVar16), iVar17 != 3)) {
    if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
       ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
      QAbstractItemViewPrivate::interruptDelayedItemsLayout
                (&this_00->super_QAbstractItemViewPrivate);
      (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8 + 0x220))();
    }
    LVar11 = QWidget::layoutDirection((QWidget *)this);
    local_68._0_4_ = (rect->x1).m_i;
    if (LVar11 == RightToLeft) {
      local_88._0_4_ = (rect->x2).m_i;
      ppuVar13 = &local_68;
      if ((int)local_68 < (int)(uint)local_88) {
        ppuVar13 = (undefined1 **)&local_88;
      }
    }
    else {
      local_88._0_4_ = (rect->x2).m_i;
      ppuVar13 = (undefined1 **)&local_88;
      if ((int)local_68 < (int)(uint)local_88) {
        ppuVar13 = &local_68;
      }
    }
    local_40 = *(undefined4 *)ppuVar13;
    iVar17 = (rect->y1).m_i;
    local_3c = (rect->y2).m_i;
    if (iVar17 < local_3c) {
      local_3c = iVar17;
    }
    LVar11 = QWidget::layoutDirection((QWidget *)this);
    iVar17 = (rect->x1).m_i;
    if (LVar11 == RightToLeft) {
      local_68 = (undefined1 *)CONCAT44(local_68._4_4_,iVar17);
      iVar5 = (rect->x2).m_i;
      local_88 = (undefined1 *)CONCAT44(local_88._4_4_,iVar5);
      ppuVar13 = (undefined1 **)&local_88;
      if (iVar17 < iVar5) {
        ppuVar13 = &local_68;
      }
    }
    else {
      local_68 = (undefined1 *)CONCAT44(local_68._4_4_,iVar17);
      iVar5 = (rect->x2).m_i;
      local_88 = (undefined1 *)CONCAT44(local_88._4_4_,iVar5);
      ppuVar13 = &local_68;
      if (iVar17 < iVar5) {
        ppuVar13 = (undefined1 **)&local_88;
      }
    }
    local_48 = *(undefined4 *)ppuVar13;
    iVar17 = (rect->y1).m_i;
    local_44 = (rect->y2).m_i;
    if (local_44 < iVar17) {
      local_44 = iVar17;
    }
    local_58 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))(&local_68,this,&local_40);
    local_78 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))(&local_88,this,&local_48);
    if ((((int)local_68 < 0) || ((long)local_68 < 0)) || (local_58 == (QAbstractItemModel *)0x0)) {
      if ((int)((uint)local_88 | local_88._4_4_) < 0 || local_78 == (QAbstractItemModel *)0x0) {
        if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                   super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 1) != 0) {
          pQVar12 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
          (**(code **)(*(long *)pQVar12 + 0x78))(pQVar12);
        }
        goto LAB_005a5792;
      }
      if ((this_00->viewItems).d.size != 0) {
        pQVar6 = (this_00->viewItems).d.ptr;
        local_58 = (pQVar6->index).m.ptr;
        local_68 = *(undefined1 **)&pQVar6->index;
        puStack_60 = (undefined1 *)(pQVar6->index).i;
      }
    }
    if (((int)((uint)local_88 | local_88._4_4_) < 0 || local_78 == (QAbstractItemModel *)0x0) &&
       ((this_00->viewItems).d.size != 0)) {
      this_01 = this_00->header;
      iVar17 = QHeaderView::count(this_01);
      iVar17 = QHeaderView::logicalIndex(this_01,iVar17 + -1);
      pQVar6 = (this_00->viewItems).d.ptr;
      lVar7 = (this_00->viewItems).d.size;
      local_98 = pQVar6[lVar7 + -1].index.m.ptr;
      pQVar6 = pQVar6 + lVar7 + -1;
      puVar9 = *(undefined1 **)&pQVar6->index;
      puStack_a0 = (undefined1 *)(pQVar6->index).i;
      local_a8 = puVar9;
      if (local_98 == (QAbstractItemModel *)0x0) {
        local_c8 = (undefined1 *)0xffffffffffffffff;
        puStack_c0 = (undefined1 *)0x0;
        local_b8 = (QAbstractItemModel *)0x0;
        puVar9 = local_c8;
        puVar10 = puStack_c0;
        pQVar8 = local_b8;
      }
      else {
        local_a8._4_4_ = (int)((ulong)puVar9 >> 0x20);
        bVar15 = local_a8._4_4_ != iVar17;
        puVar10 = puStack_a0;
        pQVar8 = local_98;
        if (bVar15) {
          in_R8 = (fd_set *)&local_a8;
          in_R9 = *(timeval **)local_98;
          (*(code *)in_R9[7].tv_sec)(&local_c8,local_98,(ulong)puVar9 & 0xffffffff,iVar17);
          puVar9 = local_c8;
          puVar10 = puStack_c0;
          pQVar8 = local_b8;
        }
      }
      local_b8 = pQVar8;
      puStack_c0 = puVar10;
      local_c8 = puVar9;
      local_78 = local_b8;
      local_88 = local_c8;
      puStack_80 = puStack_c0;
    }
    pQVar8 = (this_00->super_QAbstractItemViewPrivate).model;
    uVar14 = (**(code **)(*(long *)pQVar8 + 0x138))(pQVar8,&local_68);
    if (((uVar14 & 0x20) != 0) &&
       (pQVar8 = (this_00->super_QAbstractItemViewPrivate).model,
       uVar14 = (**(code **)(*(long *)pQVar8 + 0x138))(pQVar8,&local_88), (uVar14 & 0x20) != 0)) {
      QTreeViewPrivate::select
                (this_00,(int)&local_68,(fd_set *)&local_88,
                 (fd_set *)
                 (ulong)(uint)command.
                              super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                              super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i,in_R8,in_R9)
      ;
    }
  }
LAB_005a5792:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setSelection(const QRect &rect, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTreeView);
    if (!selectionModel() || rect.isNull())
        return;

    d->executePostedLayout();
    QPoint tl(isRightToLeft() ? qMax(rect.left(), rect.right())
              : qMin(rect.left(), rect.right()), qMin(rect.top(), rect.bottom()));
    QPoint br(isRightToLeft() ? qMin(rect.left(), rect.right()) :
              qMax(rect.left(), rect.right()), qMax(rect.top(), rect.bottom()));
    QModelIndex topLeft = indexAt(tl);
    QModelIndex bottomRight = indexAt(br);
    if (!topLeft.isValid() && !bottomRight.isValid()) {
        if (command & QItemSelectionModel::Clear)
            selectionModel()->clear();
        return;
    }
    if (!topLeft.isValid() && !d->viewItems.isEmpty())
        topLeft = d->viewItems.constFirst().index;
    if (!bottomRight.isValid() && !d->viewItems.isEmpty()) {
        const int column = d->header->logicalIndex(d->header->count() - 1);
        const QModelIndex index = d->viewItems.constLast().index;
        bottomRight = index.sibling(index.row(), column);
    }

    if (!d->isIndexEnabled(topLeft) || !d->isIndexEnabled(bottomRight))
        return;

    d->select(topLeft, bottomRight, command);
}